

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

char __thiscall duckdb::Cast::Operation<duckdb::interval_t,signed_char>(Cast *this,interval_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  PhysicalType type;
  PhysicalType type_00;
  interval_t input_00;
  interval_t input_01;
  char result;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  input_00.micros = input._0_8_;
  input_00._0_8_ = this;
  bVar1 = TryCast::Operation<duckdb::interval_t,signed_char>(input_00,&result,false);
  if (bVar1) {
    return result;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  TypeIdToString_abi_cxx11_(&local_e0,(duckdb *)0x15,type);
  ::std::operator+(&local_c0,"Type ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  ::std::operator+(&local_a0,&local_c0," with value ");
  input_01.micros = input_00.micros;
  input_01._0_8_ = this;
  ConvertToString::Operation<duckdb::interval_t>(&local_100,input_01);
  ::std::operator+(&local_80,&local_a0,&local_100);
  ::std::operator+(&local_60,&local_80," can\'t be cast to the destination type ");
  TypeIdToString_abi_cxx11_(&local_120,(duckdb *)0x3,type_00);
  ::std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
  ::std::__cxx11::string::~string((string *)&local_120);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}